

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JUnitOutputTest.cpp
# Opt level: O2

Utest * __thiscall
TEST_JUnitOutputTest_testFailureWithLessThanAndGreaterThanInsideIt_TestShell::createTest
          (TEST_JUnitOutputTest_testFailureWithLessThanAndGreaterThanInsideIt_TestShell *this)

{
  TEST_JUnitOutputTest_testFailureWithLessThanAndGreaterThanInsideIt_Test *this_00;
  
  this_00 = (TEST_JUnitOutputTest_testFailureWithLessThanAndGreaterThanInsideIt_Test *)
            operator_new(0x28,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/JUnitOutputTest.cpp"
                         ,0x202);
  TEST_JUnitOutputTest_testFailureWithLessThanAndGreaterThanInsideIt_Test::
  TEST_JUnitOutputTest_testFailureWithLessThanAndGreaterThanInsideIt_Test(this_00);
  return (Utest *)this_00;
}

Assistant:

TEST(JUnitOutputTest, testFailureWithLessThanAndGreaterThanInsideIt)
{
    testCaseRunner->start()
            .withGroup("testGroupWithFailingTest")
                .withTest("FailingTestName").thatFails("Test <failed>", "thisfile", 10)
            .end();

    outputFile = fileSystem.file("cpputest_testGroupWithFailingTest.xml");

    STRCMP_EQUAL("<failure message=\"thisfile:10: Test &lt;failed&gt;\" type=\"AssertionFailedError\">\n", outputFile->line(6));
}